

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<unsigned_long>>
::emplace_decomposable<unsigned_long,unsigned_long_const&>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
           *this,unsigned_long *key,size_t hashval,unsigned_long *args)

{
  size_t in_RCX;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_RDI;
  pair<unsigned_long,_bool> pVar1;
  size_t in_stack_00000010;
  unsigned_long *in_stack_00000018;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_00000020;
  pair<unsigned_long,_bool> res;
  size_t in_stack_ffffffffffffff88;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff90;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  iterator local_50;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_40;
  undefined1 local_38;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_30;
  bool local_28 [16];
  size_t local_18;
  
  this_00 = in_RDI;
  local_18 = in_RCX;
  pVar1 = raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
          ::find_or_prepare_insert<unsigned_long>
                    (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  local_40 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
              *)pVar1.first;
  local_38 = pVar1.second;
  local_30 = local_40;
  local_28[0] = (bool)local_38;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    emplace_at<unsigned_long_const&>
              (this_00,(size_t)in_RDI,(unsigned_long *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff90 = local_30;
    H2(local_18);
    raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
    ::set_ctrl(this_00,(size_t)in_RDI,(ctrl_t)((ulong)in_stack_ffffffffffffff90 >> 0x38));
  }
  local_50 = raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
             ::iterator_at(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>::iterator,_bool>
  ::
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>::iterator,_bool_&,_true>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>::iterator,_bool>
              *)in_RDI,&local_50,local_28);
  return (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>::iterator,_bool>
          *)this_00;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval,
			        Args&&... args)
			{
				auto res = find_or_prepare_insert(key, hashval);
				if (res.second) {
					emplace_at(res.first, std::forward<Args>(args)...);
					this->set_ctrl(res.first, H2(hashval));
				}
				return {iterator_at(res.first), res.second};
			}